

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O3

Array2D<Color> * __thiscall
TilingWFC<Color>::id_to_tiling
          (Array2D<Color> *__return_storage_ptr__,TilingWFC<Color> *this,Array2D<unsigned_int> *ids)

{
  undefined2 uVar1;
  int iVar2;
  pointer ppVar3;
  long lVar4;
  long lVar5;
  pointer pCVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint x;
  int iVar14;
  uint local_40;
  int local_3c;
  
  iVar2 = **(int **)&(((this->tiles).super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->data).
                     super__Vector_base<Array2D<Color>,_std::allocator<Array2D<Color>_>_>;
  Array2D<Color>::Array2D(__return_storage_ptr__,ids->height * iVar2,ids->width * iVar2);
  uVar9 = ids->height;
  if (uVar9 != 0) {
    uVar7 = ids->width;
    local_3c = 0;
    local_40 = 0;
    uVar10 = uVar7;
    do {
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        iVar8 = 0;
        uVar9 = 0;
        do {
          if (iVar2 != 0) {
            ppVar3 = (this->id_to_oriented_tile).
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = (ids->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10 * local_40 + uVar9];
            uVar10 = ppVar3[uVar7].first;
            iVar12 = 0;
            lVar11 = (ulong)ppVar3[uVar7].second * 0x20;
            iVar13 = local_3c;
            do {
              iVar14 = 0;
              do {
                lVar4 = *(long *)&(this->tiles).
                                  super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar10].data.
                                  super__Vector_base<Array2D<Color>,_std::allocator<Array2D<Color>_>_>
                ;
                lVar5 = *(long *)(lVar4 + 8 + lVar11);
                lVar4 = (ulong)(uint)(*(int *)(lVar4 + 4 + lVar11) * iVar12 + iVar14) * 3;
                uVar7 = __return_storage_ptr__->width * iVar13 + iVar8 + iVar14;
                pCVar6 = (__return_storage_ptr__->data).
                         super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pCVar6[uVar7].b = *(uchar *)(lVar5 + 2 + lVar4);
                uVar1 = *(undefined2 *)(lVar5 + lVar4);
                pCVar6 = pCVar6 + uVar7;
                pCVar6->r = (char)uVar1;
                pCVar6->g = (char)((ushort)uVar1 >> 8);
                iVar14 = iVar14 + 1;
              } while (iVar2 != iVar14);
              iVar12 = iVar12 + 1;
              iVar13 = iVar13 + 1;
            } while (iVar12 != iVar2);
            uVar7 = ids->width;
          }
          uVar9 = uVar9 + 1;
          iVar8 = iVar8 + iVar2;
          uVar10 = uVar7;
        } while (uVar9 < uVar7);
        uVar9 = ids->height;
      }
      local_40 = local_40 + 1;
      local_3c = local_3c + iVar2;
    } while (local_40 < uVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<T> id_to_tiling(Array2D<unsigned> ids) {
		unsigned size = tiles[0].data[0].height;
		Array2D<T> tiling(size * ids.height, size * ids.width);
		for (unsigned i = 0; i < ids.height; i++) {
			for (unsigned j = 0; j < ids.width; j++) {
				std::pair<unsigned, unsigned> oriented_tile =
					id_to_oriented_tile[ids.get(i, j)];
				for (unsigned y = 0; y < size; y++) {
					for (unsigned x = 0; x < size; x++) {
						tiling.get(i * size + y, j * size + x) =
							tiles[oriented_tile.first].data[oriented_tile.second].get(y, x);
					}
				}
			}
		}
		return tiling;
	}